

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_hang_test.c
# Opt level: O0

void callback_hang_test(int converter)

{
  char *pcVar1;
  int local_28;
  int local_24;
  int error;
  int k;
  double src_ratio;
  SRC_STATE *src_state;
  int converter_local;
  
  _error = 1.0;
  src_state._4_4_ = converter;
  pcVar1 = src_get_name(converter);
  printf("\tcallback_hang_test  (%-28s) ....... ",pcVar1);
  fflush(_stdout);
  src_ratio = (double)src_callback_new(input_callback,src_state._4_4_,1,&local_28,(void *)0x0);
  if ((SRC_STATE *)src_ratio == (SRC_STATE *)0x0) {
    pcVar1 = src_strerror(local_28);
    printf("\n\nLine %d : src_callback_new () failed : %s\n\n",0x51,pcVar1);
    exit(1);
  }
  for (local_24 = 0; local_24 < 9; local_24 = local_24 + 1) {
    alarm(1);
    _error = callback_hang_test::pairs[local_24].ratio;
    src_callback_read((SRC_STATE *)src_ratio,_error,(long)callback_hang_test::pairs[local_24].count,
                      callback_hang_test::output);
  }
  src_ratio = (double)src_delete((SRC_STATE *)src_ratio);
  alarm(0);
  puts("ok");
  return;
}

Assistant:

static void
callback_hang_test (int converter)
{	static float output [LONG_BUFFER_LEN] ;
	static SRC_PAIR pairs [] =
	{
		{ 1.2, 5 }, { 1.1, 1 }, { 1.0, 1 }, { 3.0, 1 }, { 2.0, 1 }, { 0.3, 1 },
		{ 1.2, 0 }, { 1.1, 10 }, { 1.0, 1 }
		} ;


	SRC_STATE	*src_state ;

	double src_ratio = 1.0 ;
	int k, error ;

	printf ("\tcallback_hang_test  (%-28s) ....... ", src_get_name (converter)) ;
	fflush (stdout) ;

	/* Perform sample rate conversion. */
	src_state = src_callback_new (input_callback, converter, 1, &error, NULL) ;
	if (src_state == NULL)
	{	printf ("\n\nLine %d : src_callback_new () failed : %s\n\n", __LINE__, src_strerror (error)) ;
		exit (1) ;
		} ;

	for (k = 0 ; k < ARRAY_LEN (pairs) ; k++)
	{	alarm (1) ;
		src_ratio = pairs [k].ratio ;
		src_callback_read (src_state, src_ratio, pairs [k].count, output) ;
		} ;

	src_state = src_delete (src_state) ;

	alarm (0) ;
	puts ("ok") ;

	return ;
}